

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int as154(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean,
         double *var,double *resid,double *loglik,double *hess,int cssml)

{
  double *ma;
  size_t __size;
  double *__ptr;
  uint uVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  reg_object obj;
  alik_object __ptr_00;
  double *col;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 local_b8 [8];
  custom_function as154_min;
  int P;
  int Q;
  double local_98;
  int local_78;
  int local_74;
  int p_local;
  int q_local;
  double *local_68;
  ulong local_60;
  double *local_58;
  ulong local_50;
  double *local_48;
  uint local_3c;
  ulong local_38;
  
  uVar10 = (ulong)(uint)N;
  uVar1 = N - d;
  local_78 = p;
  local_74 = q;
  local_3c = optmethod;
  local_58 = (double *)malloc((long)(int)uVar1 << 3);
  local_38 = CONCAT44(local_38._4_4_,d);
  if (cssml == 1) {
    local_50 = uVar10;
    css(inp,N,local_3c,p,d,q,phi,theta,wmean,var,resid,loglik,hess);
    as154_min.params._0_4_ = 0;
    as154_min.params._4_4_ = 0;
    iVar2 = checkroots_cerr(phi,&local_78,theta,&local_74,(double *)0x0,(int *)&as154_min.params,
                            (double *)0x0,(int *)((long)&as154_min.params + 4));
    if (iVar2 == 10) {
      return 10;
    }
    if (iVar2 == 0xc) {
      return 0xc;
    }
    local_98 = *wmean;
    uVar10 = local_50;
  }
  else {
    uVar9 = 0;
    uVar11 = 0;
    if (0 < p) {
      uVar11 = (ulong)(uint)p;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      phi[uVar9] = 0.0;
    }
    uVar9 = 0;
    uVar11 = 0;
    if (0 < q) {
      uVar11 = (ulong)(uint)q;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      theta[uVar9] = 0.0;
    }
    local_98 = 0.0;
  }
  iVar2 = (int)local_38;
  if ((int)local_38 < 1) {
    uVar9 = 0;
    uVar11 = 0;
    if (0 < (int)uVar10) {
      uVar11 = uVar10 & 0xffffffff;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      local_58[uVar9] = inp[uVar9];
    }
  }
  else {
    uVar3 = diff(inp,(int)uVar10,(int)local_38,local_58);
    uVar10 = (ulong)uVar3;
  }
  if ((-q == p && iVar2 == 0) && cssml == 1) {
    free(local_58);
    local_3c = 1;
  }
  else {
    local_50 = uVar10;
    if (iVar2 == 0) {
      local_48 = (double *)malloc(8);
      iVar8 = (int)local_50;
      pdVar4 = (double *)malloc((long)(int)local_50 * 8);
      obj = reg_init(iVar8,1);
      setIntercept(obj,1);
      regress(obj,(double *)0x0,local_58,pdVar4,local_48,0.95);
      local_98 = obj->beta[0].value;
      free(local_48);
      free(pdVar4);
      free_reg(obj);
    }
    iVar8 = (int)local_50;
    local_60 = (ulong)(uint)q;
    __ptr_00 = alik_init(p,iVar2,q,iVar8);
    __ptr_00->N = iVar8;
    uVar10 = (ulong)__ptr_00->pq;
    __size = uVar10 * 8;
    pdVar4 = (double *)malloc(__size);
    local_48 = (double *)malloc(__size);
    col = (double *)malloc(__size * uVar10);
    local_68 = (double *)malloc(__size);
    local_38 = uVar10;
    _p_local = (int *)malloc(uVar10 << 2);
    uVar10 = 0;
    uVar11 = 0;
    if (0 < p) {
      uVar11 = (ulong)(uint)p;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      pdVar4[uVar10] = phi[uVar10];
    }
    uVar10 = 0;
    uVar9 = 0;
    if (0 < (int)local_60) {
      uVar9 = local_60 & 0xffffffff;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pdVar4[(long)p + uVar10] = -theta[uVar10];
    }
    if (__ptr_00->M == 1) {
      pdVar4[(int)local_60 + p] = local_98;
    }
    __ptr_00->mean = local_98;
    lVar5 = (long)((int)local_50 * 2);
    uVar10 = 0;
    uVar7 = 0;
    if (0 < (int)local_50) {
      uVar7 = local_50 & 0xffffffff;
    }
    for (; lVar6 = (long)iVar8, uVar7 != uVar10; uVar10 = uVar10 + 1) {
      dVar12 = local_58[uVar10];
      __ptr_00->x[lVar5 + uVar10] = dVar12;
      __ptr_00->x[uVar10] = dVar12;
    }
    for (; lVar6 < lVar5; lVar6 = lVar6 + 1) {
      __ptr_00->x[lVar6] = 0.0;
    }
    local_b8 = (undefined1  [8])fas154;
    as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr_00;
    local_3c = fminunc((custom_function *)local_b8,(custom_gradient *)0x0,(int)local_38,pdVar4,1.0,
                       local_3c,local_48);
    if ((0xf < local_3c) || ((0x8011U >> (local_3c & 0x1f) & 1) == 0)) {
      local_3c = 1;
    }
    uVar10 = 0;
    uVar7 = 0;
    if (0 < (int)local_38) {
      uVar7 = local_38 & 0xffffffff;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      local_68[uVar10] = 1.0;
    }
    ma = local_48 + p;
    if (0 < (int)local_60) {
      invertroot((int)local_60,ma);
    }
    hessian_fd((custom_function *)local_b8,local_48,(int)local_38,local_68,__ptr_00->eps,hess);
    mtranspose(hess,(int)local_38,(int)local_38,col);
    iVar2 = (int)local_38;
    for (uVar10 = 0; (uint)(iVar2 * iVar2) != uVar10; uVar10 = uVar10 + 1) {
      col[uVar10] = (hess[uVar10] + col[uVar10]) * (double)(int)uVar1 * 0.5;
    }
    ludecomp(col,iVar2,_p_local);
    minverse(col,(int)local_38,_p_local,hess);
    __ptr = local_48;
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      phi[uVar10] = local_48[uVar10];
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      theta[uVar10] = -ma[uVar10];
    }
    dVar12 = 0.0;
    if (__ptr_00->M == 1) {
      dVar12 = local_48[(int)local_60 + p];
    }
    *wmean = dVar12;
    *var = __ptr_00->ssq / (double)(int)local_50;
    uVar11 = 0;
    uVar10 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar10 = uVar11;
    }
    for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      resid[uVar11] = __ptr_00->x[(long)iVar8 + uVar11];
    }
    *loglik = __ptr_00->loglik;
    free(pdVar4);
    free(__ptr);
    free(local_58);
    free(col);
    free(_p_local);
    free(local_68);
    free(__ptr_00);
  }
  return local_3c;
}

Assistant:

int as154(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean, double *var,
	double *resid,double *loglik,double *hess, int cssml) {
	int i,pq,retval,length,ret,rp,P,Q,ERR;
	double *b,*tf,*x,*dx,*thess,*varcovar,*res;
	int *ipiv;
	double maxstep,sigma,coeff;
	alik_object obj;
	reg_object fit;
	//custom_function as154_min;

	x = (double*)malloc(sizeof(double)* (N - d));

	length = N;
	
	maxstep = 1.0;

	coeff = 0.0;
	sigma = 1.0;

	if (cssml == 1) {
		css(inp, N, optmethod, p, d, q, phi, theta, wmean, var,resid,loglik,hess);
		P = 0;
		Q = 0;

		ERR = checkroots_cerr(phi, &p, theta, &q, NULL, &P, NULL, &Q);
		if (ERR == 10 || ERR == 12) return ERR;

		coeff = *wmean;
	}
	else {
		for (i = 0; i < p; ++i) phi[i] = 0.0;
		for (i = 0; i < q; ++i) theta[i] = 0.0;
	}


	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
	}

	if (p + q == 0 && d == 0 && cssml == 1) {
		free(x);
		//free_alik(obj);
		return 1;
	}

	if (d == 0) {
		rp = 1;
		varcovar = (double*)malloc(sizeof(double) * rp * rp);
		res = (double*)malloc(sizeof(double) * N);

		fit = reg_init(N, rp);

		setIntercept(fit, 1);
		regress(fit, NULL, x, res, varcovar, 0.95);

		
		coeff = (fit->beta + 0)->value;
		sigma = 10.0 * (fit->beta + 0)->stdErr;


		free(varcovar);
		free(res);
		free_reg(fit);
	}

	obj = alik_init(p, d, q, N);

	obj->N = N;
	
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}

	if (obj->M == 1) {
		b[p + q] = coeff;
	}

	obj->mean = coeff;


	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function as154_min = { fas154, obj };
	retval = fminunc(&as154_min, NULL, pq, b,maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	//Check for invertibility

	if (q > 0) {
		invertroot(q,tf+p);
	}

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);
	
	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length-d) * 0.5 * (hess[i] + thess[i]);
	}
	

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
		wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double) N;
	for (i = 0; i < length - d; ++i) {
		resid[i] = obj->x[N + i];
	}
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(ipiv);
	free(dx);
	free_alik(obj);
	return ret;
}